

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clangs.c
# Opt level: O0

float clangs(char *norm,SuperMatrix *A)

{
  float *pfVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  void *addr;
  long lVar5;
  double dVar6;
  float local_368;
  float local_364;
  double local_360;
  int local_34c;
  char local_348 [8];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  float *rwork;
  float local_38;
  float sum;
  float value;
  int irow;
  int j;
  int i;
  singlecomplex *Aval;
  NCformat *Astore;
  SuperMatrix *A_local;
  char *norm_local;
  
  local_38 = 0.0;
  pvVar2 = A->Store;
  lVar3 = *(long *)((long)pvVar2 + 8);
  if (A->nrow < A->ncol) {
    local_34c = A->nrow;
  }
  else {
    local_34c = A->ncol;
  }
  if (local_34c != 0) {
    iVar4 = strncmp(norm,"M",1);
    if (iVar4 == 0) {
      for (value = 0.0; (int)value < A->ncol; value = (float)((int)value + 1)) {
        for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(int)value * 4);
            irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)((int)value + 1) * 4);
            irow = irow + 1) {
          dVar6 = c_abs((singlecomplex *)(lVar3 + (long)irow * 8));
          if ((double)local_38 <= dVar6) {
            local_360 = c_abs((singlecomplex *)(lVar3 + (long)irow * 8));
          }
          else {
            local_360 = (double)local_38;
          }
          local_38 = (float)local_360;
        }
      }
    }
    else {
      iVar4 = strncmp(norm,"O",1);
      if ((iVar4 == 0) || (*norm == '1')) {
        for (value = 0.0; (int)value < A->ncol; value = (float)((int)value + 1)) {
          rwork._4_4_ = 0.0;
          for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(int)value * 4);
              irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)((int)value + 1) * 4);
              irow = irow + 1) {
            dVar6 = c_abs((singlecomplex *)(lVar3 + (long)irow * 8));
            rwork._4_4_ = (float)((double)rwork._4_4_ + dVar6);
          }
          if (local_38 <= rwork._4_4_) {
            local_364 = rwork._4_4_;
          }
          else {
            local_364 = local_38;
          }
          local_38 = local_364;
        }
      }
      else {
        iVar4 = strncmp(norm,"I",1);
        if (iVar4 == 0) {
          addr = superlu_malloc((long)A->nrow << 2);
          if (addr == (void *)0x0) {
            sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork.",0x67
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/clangs.c"
                   );
            superlu_abort_and_exit(msg_1 + 0xf8);
          }
          for (irow = 0; irow < A->nrow; irow = irow + 1) {
            *(undefined4 *)((long)addr + (long)irow * 4) = 0;
          }
          for (value = 0.0; (int)value < A->ncol; value = (float)((int)value + 1)) {
            for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(int)value * 4);
                irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)((int)value + 1) * 4);
                irow = irow + 1) {
              iVar4 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)irow * 4);
              dVar6 = c_abs((singlecomplex *)(lVar3 + (long)irow * 8));
              lVar5 = (long)iVar4;
              *(float *)((long)addr + lVar5 * 4) =
                   (float)((double)*(float *)((long)addr + lVar5 * 4) + dVar6);
            }
          }
          for (irow = 0; irow < A->nrow; irow = irow + 1) {
            pfVar1 = (float *)((long)addr + (long)irow * 4);
            if (local_38 < *pfVar1 || local_38 == *pfVar1) {
              local_368 = *(float *)((long)addr + (long)irow * 4);
            }
            else {
              local_368 = local_38;
            }
            local_38 = local_368;
          }
          superlu_free(addr);
        }
        else {
          iVar4 = strncmp(norm,"F",1);
          if ((iVar4 == 0) || (iVar4 = strncmp(norm,"E",1), iVar4 == 0)) {
            sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Not implemented.",0x75,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/clangs.c"
                   );
            superlu_abort_and_exit(msg_2 + 0xf8);
          }
          else {
            sprintf(local_348,"%s at line %d in file %s\n","Illegal norm specified.",0x77,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/clangs.c"
                   );
            superlu_abort_and_exit(local_348);
          }
        }
      }
    }
  }
  return local_38;
}

Assistant:

float clangs(char *norm, SuperMatrix *A)
{
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int      i, j, irow;
    float   value = 0., sum;
    float   *rwork;

    Astore = A->Store;
    Aval   = Astore->nzval;
    
    if ( SUPERLU_MIN(A->nrow, A->ncol) == 0) {
    } else if (strncmp(norm, "M", 1)==0) {
	/* Find max(abs(A(i,j))). */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++)
		value = SUPERLU_MAX( value, c_abs( &Aval[i]) );
	
    } else if (strncmp(norm, "O", 1)==0 || *(unsigned char *)norm == '1') {
	/* Find norm1(A). */
	for (j = 0; j < A->ncol; ++j) {
	    sum = 0.;
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) 
		sum += c_abs( &Aval[i] );
	    value = SUPERLU_MAX(value,sum);
	}
	
    } else if (strncmp(norm, "I", 1)==0) {
	/* Find normI(A). */
	if ( !(rwork = (float *) SUPERLU_MALLOC(A->nrow * sizeof(float))) )
	    ABORT("SUPERLU_MALLOC fails for rwork.");
	for (i = 0; i < A->nrow; ++i) rwork[i] = 0.;
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) {
		irow = Astore->rowind[i];
		rwork[irow] += c_abs( &Aval[i] );
	    }
	for (i = 0; i < A->nrow; ++i)
	    value = SUPERLU_MAX(value, rwork[i]);
	
	SUPERLU_FREE (rwork);
	
    } else if (strncmp(norm, "F", 1)==0 || strncmp(norm, "E", 1)==0) {
	/* Find normF(A). */
	ABORT("Not implemented.");
    } else
	ABORT("Illegal norm specified.");

    return (value);

}